

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O2

void __thiscall VCFilter::addFiles(VCFilter *this,ProStringList *fileList)

{
  long lVar1;
  int i;
  ulong uVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < (ulong)(fileList->super_QList<ProString>).d.size; uVar2 = uVar2 + 1) {
    ProString::toQString
              ((QString *)&QStack_48,
               (ProString *)
               ((long)&(((fileList->super_QList<ProString>).d.ptr)->m_string).d.d + lVar1));
    addFile(this,(QString *)&QStack_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
    lVar1 = lVar1 + 0x30;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VCFilter::addFiles(const ProStringList& fileList)
{
    for (int i = 0; i < fileList.size(); ++i)
        addFile(fileList.at(i).toQString());
}